

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCShapeProfileDef::~IfcCShapeProfileDef(IfcCShapeProfileDef *this)

{
  ~IfcCShapeProfileDef
            ((IfcCShapeProfileDef *)
             &this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68);
  return;
}

Assistant:

IfcCShapeProfileDef() : Object("IfcCShapeProfileDef") {}